

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,bool value)

{
  buffer_appender<char> bVar1;
  size_t in_RCX;
  void *in_RDX;
  bool value_local;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  
  if ((this->specs_ == (format_specs *)0x0) || (this->specs_->type == '\0')) {
    write(this,(uint)value,in_RDX,in_RCX);
    this_local = (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)(this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                    container;
  }
  else {
    if (this->specs_ == (format_specs *)0x0) {
      bVar1 = write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                        ((buffer_appender<char>)
                         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container,(uint)value);
      (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    }
    else {
      write_int<int>(this,(uint)value,this->specs_);
    }
    this_local = (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)(this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                    container;
  }
  return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)this_local;
}

Assistant:

iterator operator()(bool value) {
    if (specs_ && specs_->type) return (*this)(value ? 1 : 0);
    write(value != 0);
    return out_;
  }